

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landbasedtracked.cpp
# Opt level: O2

void __thiscall fp::LandBasedTracked::Release(LandBasedTracked *this,string *string)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"LandBasedTracked::Release payload is called\n");
  poVar1 = std::operator<<(poVar1,(string *)string);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void fp::LandBasedTracked::Release(std::string string) {
    std::cerr << "LandBasedTracked::Release payload is called\n" << string << std::endl;
}